

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *
cppwinrt::get_bases(vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                    *__return_storage_ptr__,TypeDef *type)

{
  bool bVar1;
  TypeDef TVar2;
  undefined1 local_30 [8];
  TypeDef base;
  TypeDef *type_local;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *bases;
  
  base.super_row_base<winmd::reader::TypeDef>._15_1_ = 0;
  std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::vector
            (__return_storage_ptr__);
  TVar2 = get_base_class(type);
  local_30 = (undefined1  [8])TVar2.super_row_base<winmd::reader::TypeDef>.m_table;
  base.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ =
       TVar2.super_row_base<winmd::reader::TypeDef>.m_index;
  while (bVar1 = winmd::reader::row_base::operator_cast_to_bool((row_base *)local_30), bVar1) {
    std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::push_back
              (__return_storage_ptr__,(value_type *)local_30);
    TVar2 = get_base_class((TypeDef *)local_30);
    local_30 = (undefined1  [8])TVar2.super_row_base<winmd::reader::TypeDef>.m_table;
    base.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ =
         TVar2.super_row_base<winmd::reader::TypeDef>.m_index;
  }
  return __return_storage_ptr__;
}

Assistant:

static auto get_bases(TypeDef const& type)
    {
        std::vector<TypeDef> bases;

        for (auto base = get_base_class(type); base; base = get_base_class(base))
        {
            bases.push_back(base);
        }

        return bases;
    }